

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

int P_Thing_Warp(AActor *caller,AActor *reference,double xofs,double yofs,double zofs,DAngle *angle,
                int flags,double heightoffset,double radiusoffset,DAngle *pitch)

{
  double dVar1;
  double dVar2;
  double z;
  bool bVar3;
  int iVar4;
  AActor *pAVar5;
  AActor *this;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  DVector2 v;
  DVector2 local_50;
  DAngle local_40;
  DAngle local_38;
  
  this = reference;
  if (((uint)flags >> 0xc & 1) == 0) {
    this = caller;
    caller = reference;
  }
  dVar1 = (this->__Pos).X;
  dVar2 = (this->__Pos).Y;
  z = (this->__Pos).Z;
  iVar6 = this->Sector->PortalGroup;
  dVar13 = caller->Height;
  if ((flags & 2U) == 0) {
    pAVar5 = this;
    if ((flags & 4U) == 0) {
      pAVar5 = caller;
    }
    angle->Degrees = (pAVar5->Angles).Yaw.Degrees + angle->Degrees;
  }
  dVar11 = heightoffset * dVar13 + zofs;
  dVar12 = radiusoffset * caller->radius;
  dVar13 = FFastTrig::sin(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  dVar10 = FFastTrig::cos(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  if (((uint)flags >> 10 & 1) == 0) {
    if ((flags & 1U) == 0) {
      dVar9 = dVar13 * yofs;
      yofs = xofs * dVar13 - yofs * dVar10;
      xofs = dVar9 + dVar10 * xofs;
    }
    dVar10 = dVar10 * dVar12 + xofs;
    dVar13 = dVar13 * dVar12 + yofs;
    if (((uint)flags >> 8 & 1) == 0) {
      P_GetOffsetPosition((caller->__Pos).X,(caller->__Pos).Y,dVar10,dVar13);
      AActor::SetOrigin(this,local_50.X,local_50.Y,dVar11 + (caller->__Pos).Z,true);
    }
    else {
      P_GetOffsetPosition((caller->__Pos).X,(caller->__Pos).Y,dVar10,dVar13);
      AActor::SetOrigin(this,local_50.X,local_50.Y,(caller->__Pos).Z + 0.0,true);
LAB_0045d63b:
      (this->__Pos).Z = dVar11 + this->floorz;
    }
  }
  else {
    AActor::SetOrigin(this,dVar10 * dVar12 + xofs,dVar13 * dVar12 + yofs,dVar11,true);
    if (((uint)flags >> 8 & 1) != 0) goto LAB_0045d63b;
  }
  if (((flags & 8U) == 0) && (bVar3 = P_TestMobjLocation(this), !bVar3)) {
    AActor::SetOrigin(this,dVar1,dVar2,z,true);
    return 0;
  }
  if (((uint)flags >> 9 & 1) != 0) {
    AActor::SetOrigin(this,dVar1,dVar2,z,true);
    return 1;
  }
  (this->Angles).Yaw.Degrees = angle->Degrees;
  if ((short)flags < 0) {
    local_38.Degrees = (caller->Angles).Pitch.Degrees;
    AActor::SetPitch(this,&local_38,false,false);
  }
  dVar13 = pitch->Degrees;
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_40.Degrees = dVar13 + (this->Angles).Pitch.Degrees;
    AActor::SetPitch(this,&local_40,false,false);
  }
  if (((uint)flags >> 0xe & 1) != 0) {
    (this->Vel).Z = (caller->Vel).Z;
    (this->Vel).Y = (caller->Vel).Y;
    (this->Vel).X = (caller->Vel).X;
  }
  if ((char)flags < '\0') {
    (this->Vel).X = 0.0;
    (this->Vel).Y = 0.0;
    (this->Vel).Z = 0.0;
  }
  if ((flags & 0x20U) == 0) {
    if ((flags & 0x40U) == 0) {
      if ((flags & 0x10U) != 0) goto LAB_0045d968;
      dVar1 = (this->__Pos).X;
      dVar2 = (this->__Pos).Y;
      (this->Prev).Z = (this->__Pos).Z;
      (this->Prev).X = dVar1;
      (this->Prev).Y = dVar2;
      (this->PrevAngles).Roll.Degrees = (this->Angles).Roll.Degrees;
      dVar1 = (this->Angles).Yaw.Degrees;
      (this->PrevAngles).Pitch.Degrees = (this->Angles).Pitch.Degrees;
      (this->PrevAngles).Yaw.Degrees = dVar1;
      if (this->Sector == (sector_t *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = this->Sector->PortalGroup;
      }
    }
    else {
      iVar4 = this->Sector->PortalGroup;
      dVar10 = 0.0;
      dVar13 = 0.0;
      uVar7 = 0;
      uVar8 = 0;
      if (caller->PrevPortalGroup != iVar4) {
        iVar6 = Displacements.size * iVar4 + caller->PrevPortalGroup;
        dVar13 = Displacements.data.Array[iVar6].pos.X;
        uVar7 = SUB84(dVar13,0);
        uVar8 = (undefined4)((ulong)dVar13 >> 0x20);
        dVar13 = Displacements.data.Array[iVar6].pos.Y;
      }
      iVar6 = caller->Sector->PortalGroup;
      dVar11 = 0.0;
      if (iVar6 != iVar4) {
        iVar6 = Displacements.size * iVar4 + iVar6;
        dVar11 = Displacements.data.Array[iVar6].pos.X;
        dVar10 = Displacements.data.Array[iVar6].pos.Y;
      }
      dVar12 = (this->__Pos).X;
      dVar9 = (this->__Pos).Y;
      (this->Prev).Z = ((this->__Pos).Z + z) - z;
      (this->Prev).Y = (dVar13 + dVar2 + dVar9) - (dVar2 + dVar10);
      (this->Prev).X = ((double)CONCAT44(uVar8,uVar7) + dVar1 + dVar12) - (dVar1 + dVar11);
    }
  }
  else {
    iVar4 = this->Sector->PortalGroup;
    uVar7 = 0;
    uVar8 = 0;
    dVar13 = 0.0;
    if (iVar6 != iVar4) {
      iVar6 = Displacements.size * iVar4 + iVar6;
      dVar13 = Displacements.data.Array[iVar6].pos.X;
      dVar10 = Displacements.data.Array[iVar6].pos.Y;
      uVar7 = SUB84(dVar10,0);
      uVar8 = (undefined4)((ulong)dVar10 >> 0x20);
    }
    dVar10 = (this->__Pos).Y;
    dVar11 = (this->__Pos).Z;
    (this->Prev).X = ((this->__Pos).X - (dVar1 + dVar13)) + (this->Prev).X;
    (this->Prev).Y = (dVar10 - (dVar2 + (double)CONCAT44(uVar8,uVar7))) + (this->Prev).Y;
    (this->Prev).Z = (dVar11 - z) + (this->Prev).Z;
  }
  this->PrevPortalGroup = iVar4;
LAB_0045d968:
  if ((((uint)flags >> 0xb & 1) != 0) && (((caller->flags2).Value & 0x80000) != 0)) {
    dVar1 = AActor::GetBobOffset(caller,0.0);
    (this->__Pos).Z = dVar1 + (this->__Pos).Z;
  }
  local_50.X = (this->__Pos).X;
  local_50.Y = (this->__Pos).Y;
  P_TryMove(this,&local_50,0,(secplane_t *)0x0);
  return 1;
}

Assistant:

int P_Thing_Warp(AActor *caller, AActor *reference, double xofs, double yofs, double zofs, DAngle angle, int flags, double heightoffset, double radiusoffset, DAngle pitch)
{
	if (flags & WARPF_MOVEPTR)
	{
		AActor *temp = reference;
		reference = caller;
		caller = temp;
	}

	DVector3 old = caller->Pos();
	int oldpgroup = caller->Sector->PortalGroup;

	zofs += reference->Height * heightoffset;
	

	if (!(flags & WARPF_ABSOLUTEANGLE))
	{
		angle += (flags & WARPF_USECALLERANGLE) ? caller->Angles.Yaw: reference->Angles.Yaw;
	}

	const double rad = radiusoffset * reference->radius;
	const double s = angle.Sin();
	const double c = angle.Cos();

	if (!(flags & WARPF_ABSOLUTEPOSITION))
	{
		if (!(flags & WARPF_ABSOLUTEOFFSET))
		{
			double xofs1 = xofs;

			// (borrowed from A_SpawnItemEx, assumed workable)
			// in relative mode negative y values mean 'left' and positive ones mean 'right'
			// This is the inverse orientation of the absolute mode!
			
			xofs = xofs1 * c + yofs * s;
			yofs = xofs1 * s - yofs * c;
		}

		if (flags & WARPF_TOFLOOR)
		{
			// set correct xy
			// now the caller's floorz should be appropriate for the assigned xy-position
			// assigning position again with.
			// extra unlink, link and environment calculation
			caller->SetOrigin(reference->Vec3Offset(xofs + rad * c, yofs + rad * s, 0.), true);
			// The two-step process is important.
			caller->SetZ(caller->floorz + zofs);
		}
		else
		{
			caller->SetOrigin(reference->Vec3Offset(xofs + rad * c, yofs + rad * s, zofs), true);
		}
	}
	else // [MC] The idea behind "absolute" is meant to be "absolute". Override everything, just like A_SpawnItemEx's.
	{
		caller->SetOrigin(xofs + rad * c, yofs + rad * s, zofs, true);
		if (flags & WARPF_TOFLOOR)
		{
			caller->SetZ(caller->floorz + zofs);
		}
	}

	if ((flags & WARPF_NOCHECKPOSITION) || P_TestMobjLocation(caller))
	{
		if (flags & WARPF_TESTONLY)
		{
			caller->SetOrigin(old, true);
		}
		else
		{
			caller->Angles.Yaw = angle;

			if (flags & WARPF_COPYPITCH)
				caller->SetPitch(reference->Angles.Pitch, false);
			
			if (pitch != 0)
				caller->SetPitch(caller->Angles.Pitch + pitch, false);
			
			if (flags & WARPF_COPYVELOCITY)
			{
				caller->Vel = reference->Vel;
			}
			if (flags & WARPF_STOP)
			{
				caller->Vel.Zero();
			}

			// this is no fun with line portals 
			if (flags & WARPF_WARPINTERPOLATION)
			{
				// This just translates the movement but doesn't change the vector
				DVector3 displacedold  = old + Displacements.getOffset(oldpgroup, caller->Sector->PortalGroup);
				caller->Prev += caller->Pos() - displacedold;
				caller->PrevPortalGroup = caller->Sector->PortalGroup;
			}
			else if (flags & WARPF_COPYINTERPOLATION)
			{
				// Map both positions of the reference actor to the current portal group
				DVector3 displacedold = old + Displacements.getOffset(reference->PrevPortalGroup, caller->Sector->PortalGroup);
				DVector3 displacedref = old + Displacements.getOffset(reference->Sector->PortalGroup, caller->Sector->PortalGroup);
				caller->Prev = caller->Pos() + displacedold - displacedref;
				caller->PrevPortalGroup = caller->Sector->PortalGroup;
			}
			else if (!(flags & WARPF_INTERPOLATE))
			{
				caller->ClearInterpolation();
			}

			if ((flags & WARPF_BOB) && (reference->flags2 & MF2_FLOATBOB))
			{
				caller->AddZ(reference->GetBobOffset());
			}
			P_TryMove(caller, caller->Pos(), false);
		}
		return true;
	}
	caller->SetOrigin(old, true);
	return false;
}